

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandAssign.cpp
# Opt level: O0

string * __thiscall
CommandAssign::describe_abi_cxx11_(string *__return_storage_ptr__,CommandAssign *this)

{
  string local_e8;
  string local_c8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  CommandAssign *local_18;
  CommandAssign *this_local;
  
  local_18 = this;
  this_local = (CommandAssign *)__return_storage_ptr__;
  AST::describe_abi_cxx11_(&local_98,(AST *)this);
  std::operator+(&local_78,&local_98," ");
  Expression::describe_abi_cxx11_(&local_c8,&this->super_Expression);
  std::operator+(&local_58,&local_78,&local_c8);
  std::operator+(&local_38,&local_58," ");
  VarName::describe_abi_cxx11_(&local_e8,&this->super_VarName);
  std::operator+(__return_storage_ptr__,&local_38,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  return __return_storage_ptr__;
}

Assistant:

std::string CommandAssign::describe() {
    return Command::describe() + " " + Expression::describe() + " " + VarName::describe();
}